

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalKdevelopGenerator::CreateProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *projectname,
          string *executable,string *cmakeFilePattern,string *fileToOpen)

{
  bool bVar1;
  char *pcVar2;
  unsigned_long uVar3;
  undefined1 local_128 [8];
  string tmp;
  undefined1 local_100 [8];
  string nextFile;
  uint i;
  size_t numf;
  Directory d;
  undefined1 local_a8 [8];
  string sessionFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string filename;
  string *cmakeFilePattern_local;
  string *executable_local;
  string *projectname_local;
  string *projectDir_local;
  string *outputDir_local;
  cmGlobalKdevelopGenerator *this_local;
  
  filename.field_2._8_8_ = cmakeFilePattern;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Blacklist);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 outputDir,"/");
  std::operator+(&local_78,projectname,".kdevelop");
  std::__cxx11::string::operator+=((string *)local_58,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 outputDir,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,projectname
                 ,".kdevses");
  std::__cxx11::string::operator+=((string *)local_a8,(string *)&d);
  std::__cxx11::string::~string((string *)&d);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (bVar1) {
    MergeProjectFiles(this,outputDir,projectDir,(string *)local_58,executable,
                      (string *)filename.field_2._8_8_,fileToOpen,(string *)local_a8);
  }
  else {
    cmsys::Directory::Directory((Directory *)&numf);
    bVar1 = cmsys::Directory::Load((Directory *)&numf,projectDir);
    if (bVar1) {
      uVar3 = cmsys::Directory::GetNumberOfFiles((Directory *)&numf);
      for (nextFile.field_2._12_4_ = 0; (uint)nextFile.field_2._12_4_ < uVar3;
          nextFile.field_2._12_4_ = nextFile.field_2._12_4_ + 1) {
        pcVar2 = cmsys::Directory::GetFile((Directory *)&numf,(ulong)(uint)nextFile.field_2._12_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_100,pcVar2,(allocator *)(tmp.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_100,".");
        if ((bVar1) &&
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_100,".."), bVar1)) {
          std::__cxx11::string::string((string *)local_128,(string *)projectDir);
          std::__cxx11::string::operator+=((string *)local_128,"/");
          std::__cxx11::string::operator+=((string *)local_128,(string *)local_100);
          bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_128);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)local_128,"/CMakeCache.txt");
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_100,"CMakeFiles");
            if (!bVar1) {
              pcVar2 = (char *)std::__cxx11::string::c_str();
              bVar1 = cmsys::SystemTools::FileExists(pcVar2);
              if (!bVar1) goto LAB_0049da44;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Blacklist,(value_type *)local_100);
          }
LAB_0049da44:
          std::__cxx11::string::~string((string *)local_128);
        }
        std::__cxx11::string::~string((string *)local_100);
      }
    }
    CreateNewProjectFile
              (this,outputDir,projectDir,(string *)local_58,executable,
               (string *)filename.field_2._8_8_,fileToOpen,(string *)local_a8);
    cmsys::Directory::~Directory((Directory *)&numf);
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator
::CreateProjectFile(const std::string& outputDir,
                    const std::string& projectDir,
                    const std::string& projectname,
                    const std::string& executable,
                    const std::string& cmakeFilePattern,
                    const std::string& fileToOpen)
{
  this->Blacklist.clear();

  std::string filename=outputDir+"/";
  filename+=projectname+".kdevelop";
  std::string sessionFilename=outputDir+"/";
  sessionFilename+=projectname+".kdevses";

  if (cmSystemTools::FileExists(filename.c_str()))
    {
    this->MergeProjectFiles(outputDir, projectDir, filename,
                            executable, cmakeFilePattern,
                            fileToOpen, sessionFilename);
    }
  else
    {
    // add all subdirectories which are cmake build directories to the
    // kdevelop blacklist so they are not monitored for added or removed files
    // since this is handled by adding files to the cmake files
    cmsys::Directory d;
    if (d.Load(projectDir))
      {
      size_t numf = d.GetNumberOfFiles();
      for (unsigned int i = 0; i < numf; i++)
        {
        std::string nextFile = d.GetFile(i);
        if ((nextFile!=".") && (nextFile!=".."))
          {
          std::string tmp = projectDir;
          tmp += "/";
          tmp += nextFile;
          if (cmSystemTools::FileIsDirectory(tmp))
            {
            tmp += "/CMakeCache.txt";
            if ((nextFile == "CMakeFiles")
                || (cmSystemTools::FileExists(tmp.c_str())))
              {
              this->Blacklist.push_back(nextFile);
              }
            }
          }
        }
      }
    this->CreateNewProjectFile(outputDir, projectDir, filename,
                               executable, cmakeFilePattern,
                               fileToOpen, sessionFilename);
    }

}